

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

size_t chunk_read(buf_chunk *chunk,uchar *buf,size_t len)

{
  void *__src;
  size_t n;
  uchar *p;
  size_t len_local;
  uchar *buf_local;
  buf_chunk *chunk_local;
  
  __src = (void *)((long)&chunk->x + chunk->r_offset);
  chunk_local = (buf_chunk *)(chunk->w_offset - chunk->r_offset);
  if (chunk_local == (buf_chunk *)0x0) {
    chunk_local = (buf_chunk *)0x0;
  }
  else if (len < chunk_local) {
    memcpy(buf,__src,len);
    chunk->r_offset = len + chunk->r_offset;
    chunk_local = (buf_chunk *)len;
  }
  else {
    memcpy(buf,__src,(size_t)chunk_local);
    chunk->w_offset = 0;
    chunk->r_offset = 0;
  }
  return (size_t)chunk_local;
}

Assistant:

static size_t chunk_read(struct buf_chunk *chunk,
                         unsigned char *buf, size_t len)
{
  unsigned char *p = &chunk->x.data[chunk->r_offset];
  size_t n = chunk->w_offset - chunk->r_offset;
  DEBUGASSERT(chunk->w_offset >= chunk->r_offset);
  if(!n) {
    return 0;
  }
  else if(n <= len) {
    memcpy(buf, p, n);
    chunk->r_offset = chunk->w_offset = 0;
    return n;
  }
  else {
    memcpy(buf, p, len);
    chunk->r_offset += len;
    return len;
  }
}